

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiCutFab.cpp
# Opt level: O0

bool __thiscall amrex::MultiCutFab::ok(MultiCutFab *this,MFIter *mfi)

{
  FabType FVar1;
  EBCellFlagFab *this_00;
  FabArray<amrex::EBCellFlagFab> *in_RSI;
  MFIter *in_stack_ffffffffffffffe8;
  
  this_00 = FabArray<amrex::EBCellFlagFab>::operator[](in_RSI,in_stack_ffffffffffffffe8);
  FVar1 = EBCellFlagFab::getType(this_00);
  return FVar1 == singlevalued;
}

Assistant:

bool
MultiCutFab::ok (const MFIter& mfi) const noexcept
{
    return (*m_cellflags)[mfi].getType() == FabType::singlevalued;
}